

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_19656::IDLExportVisitor::visit_(IDLExportVisitor *this,Enum *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  ostream *poVar3;
  long lVar4;
  _List_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  ResultT Result;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  symbols;
  string local_78;
  string local_58;
  ostream *local_38;
  
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"enum ",5);
  Typelib::Type::getBasename_abi_cxx11_();
  stripLeadingUnderscore(&local_78,&local_58);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," { ",3);
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58.field_2._M_allocated_capacity = 0;
  local_58._M_dataplus._M_p = (pointer)&local_58;
  local_58._M_string_length = (size_type)&local_58;
  local_38 = (ostream *)&this->m_stream;
  lVar4 = Typelib::Enum::values_abi_cxx11_();
  p_Var6 = *(_Rb_tree_node_base **)(lVar4 + 0x18);
  _Var2._M_p = local_58._M_dataplus._M_p;
  while (local_58._M_dataplus._M_p = _Var2._M_p, p_Var6 != (_Rb_tree_node_base *)(lVar4 + 8)) {
    stripLeadingUnderscore(&local_78,(string *)(p_Var6 + 1));
    p_Var5 = (_List_node_base *)operator_new(0x30);
    p_Var5[1]._M_next = p_Var5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == paVar1) {
      p_Var5[2]._M_next =
           (_List_node_base *)
           CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
      p_Var5[2]._M_prev = (_List_node_base *)local_78.field_2._8_8_;
    }
    else {
      p_Var5[1]._M_next = (_List_node_base *)local_78._M_dataplus._M_p;
      p_Var5[2]._M_next =
           (_List_node_base *)
           CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,local_78.field_2._M_local_buf[0]);
    }
    p_Var5[1]._M_prev = (_List_node_base *)local_78._M_string_length;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    local_58.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    _Var2._M_p = local_58._M_dataplus._M_p;
  }
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)paVar1;
  if ((string *)_Var2._M_p != &local_58) {
    std::__cxx11::string::replace
              ((ulong)&local_78,0,(char *)0x0,
               (((string *)_Var2._M_p)->field_2)._M_allocated_capacity);
    _Var2._M_p = (((string *)_Var2._M_p)->_M_dataplus)._M_p;
  }
  for (; (string *)_Var2._M_p != &local_58; _Var2._M_p = (((string *)_Var2._M_p)->_M_dataplus)._M_p)
  {
    std::__cxx11::string::replace((ulong)&local_78,local_78._M_string_length,(char *)0x0,0x11841f);
    std::__cxx11::string::replace
              ((ulong)&local_78,local_78._M_string_length,(char *)0x0,
               (((string *)_Var2._M_p)->field_2)._M_allocated_capacity);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_38,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," };\n",4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_58);
  return true;
}

Assistant:

bool IDLExportVisitor::visit_ (Enum const& type)
    {
        m_stream << m_indent << "enum " << stripLeadingUnderscore(type.getBasename()) << " { ";

        list<string> symbols;
        Enum::ValueMap const& values = type.values();
        Enum::ValueMap::const_iterator it, end = values.end();
        for (it = values.begin(); it != end; ++it)
            symbols.push_back(stripLeadingUnderscore(it->first));
        m_stream << join(symbols, ", ") << " };\n";

        return true;
    }